

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O1

void secp256k1_modinv32_update_fg_30_var
               (int len,secp256k1_modinv32_signed30 *f,secp256k1_modinv32_signed30 *g,
               secp256k1_modinv32_trans2x2 *t)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  bool bVar36;
  bool bVar37;
  undefined1 auVar38 [16];
  int iVar39;
  uint uVar40;
  uint uVar41;
  undefined4 uVar42;
  uint extraout_EAX;
  ulong uVar43;
  long lVar44;
  secp256k1_modinv32_signed30 *psVar45;
  int iVar46;
  secp256k1_modinv32_signed30 *psVar47;
  int extraout_EDX;
  uint uVar48;
  uint uVar49;
  int extraout_EDX_00;
  int extraout_EDX_01;
  uint *extraout_RDX;
  int32_t *piVar50;
  long lVar51;
  secp256k1_modinv32_signed30 *b;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  long unaff_RBX;
  secp256k1_fe *psVar58;
  ulong uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  secp256k1_fe *psVar63;
  ulong uVar64;
  secp256k1_fe *psVar65;
  secp256k1_fe *a;
  undefined4 in_register_0000003c;
  secp256k1_modinv32_signed30 *a_00;
  secp256k1_modinv32_signed30 *a_01;
  long lVar66;
  ulong uVar67;
  secp256k1_fe *r;
  secp256k1_fe *r_00;
  uint uVar68;
  uint uVar69;
  ulong uVar70;
  ulong uVar71;
  uint uVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  long lVar81;
  long lVar82;
  uint uVar83;
  secp256k1_modinv32_signed30 *psVar84;
  code *pcVar85;
  uint uVar86;
  secp256k1_modinv32_signed30 *psVar87;
  uint uVar88;
  code *pcVar89;
  code *pcVar90;
  uint extraout_XMM0_Da;
  uint extraout_XMM0_Db;
  uint extraout_XMM0_Dc;
  undefined1 auVar91 [16];
  uint extraout_XMM0_Dd;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  uchar auStack_2d8 [40];
  secp256k1_fe *psStack_2b0;
  code *pcStack_2a8;
  ulong uStack_2a0;
  secp256k1_fe *psStack_298;
  code *pcStack_290;
  secp256k1_fe *psStack_288;
  code *pcStack_278;
  undefined1 auStack_270 [32];
  secp256k1_fe sStack_250;
  undefined1 auStack_220 [16];
  undefined1 auStack_208 [48];
  undefined8 uStack_1d8;
  secp256k1_fe *psStack_1d0;
  undefined8 uStack_1c8;
  code *pcStack_1c0;
  secp256k1_fe sStack_1b8;
  secp256k1_fe sStack_188;
  secp256k1_fe sStack_158;
  ulong uStack_120;
  ulong uStack_118;
  ulong uStack_110;
  secp256k1_modinv32_signed30 *psStack_108;
  ulong uStack_100;
  code *pcStack_f8;
  uint uStack_f0;
  uint uStack_ec;
  uint uStack_e8;
  uint uStack_e4;
  uint uStack_e0;
  uint uStack_dc;
  secp256k1_modinv32_signed30 *psStack_d8;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  uint uStack_c0;
  int32_t iStack_bc;
  secp256k1_modinv32_signed30 *psStack_b8;
  secp256k1_modinv32_signed30 *psStack_b0;
  secp256k1_modinv32_signed30 *psStack_a8;
  secp256k1_modinv32_signed30 *psStack_a0;
  secp256k1_modinv32_signed30 *psStack_98;
  code *pcStack_90;
  long lStack_80;
  long lStack_78;
  long lStack_70;
  
  a_00 = (secp256k1_modinv32_signed30 *)CONCAT44(in_register_0000003c,len);
  if (len < 1) {
    secp256k1_modinv32_update_fg_30_var_cold_3();
LAB_001570bb:
    iVar46 = (int)t;
    secp256k1_modinv32_update_fg_30_var_cold_1();
  }
  else {
    iVar39 = t->v;
    iVar1 = t->u;
    unaff_RBX = (long)f->v[0];
    uVar43 = (long)g->v[0] * (long)iVar39 + unaff_RBX * iVar1;
    if ((uVar43 & 0x3fffffff) != 0) goto LAB_001570bb;
    iVar2 = t->r;
    iVar46 = t->q;
    unaff_RBX = unaff_RBX * iVar46;
    uVar80 = (long)g->v[0] * (long)iVar2 + unaff_RBX;
    if ((uVar80 & 0x3fffffff) == 0) {
      lVar81 = (long)uVar80 >> 0x1e;
      lVar44 = (long)uVar43 >> 0x1e;
      if (len != 1) {
        uVar43 = 1;
        do {
          lVar44 = (long)g->v[uVar43] * (long)iVar39 + (long)f->v[uVar43] * (long)iVar1 + lVar44;
          lVar81 = (long)g->v[uVar43] * (long)iVar2 + (long)f->v[uVar43] * (long)iVar46 + lVar81;
          f->v[uVar43 - 1] = (uint)lVar44 & 0x3fffffff;
          g->v[uVar43 - 1] = (uint)lVar81 & 0x3fffffff;
          uVar43 = uVar43 + 1;
          lVar81 = lVar81 >> 0x1e;
          lVar44 = lVar44 >> 0x1e;
        } while ((uint)len != uVar43);
      }
      f->v[(long)len + -1] = (int32_t)lVar44;
      g->v[(long)len + -1] = (int32_t)lVar81;
      return;
    }
  }
  secp256k1_modinv32_update_fg_30_var_cold_2();
  lVar44 = 0;
  psVar45 = (secp256k1_modinv32_signed30 *)0x0;
  do {
    if (lVar44 < extraout_EDX) {
      psVar45 = (secp256k1_modinv32_signed30 *)
                ((long)psVar45->v + (long)f->v[lVar44] * (long)iVar46);
    }
    a_00->v[lVar44] = (uint)psVar45 & 0x3fffffff;
    psVar45 = (secp256k1_modinv32_signed30 *)((long)psVar45 >> 0x1e);
    lVar44 = lVar44 + 1;
  } while (lVar44 != 8);
  if (8 < extraout_EDX) {
    psVar45 = (secp256k1_modinv32_signed30 *)((long)psVar45->v + (long)f->v[8] * (long)iVar46);
  }
  psVar47 = (secp256k1_modinv32_signed30 *)(long)(int)psVar45;
  if (psVar47 == psVar45) {
    a_00->v[8] = (int)psVar45;
    return;
  }
  secp256k1_modinv32_mul_30_cold_1();
  uVar61 = *extraout_RDX;
  psVar87 = (secp256k1_modinv32_signed30 *)(long)(int)uVar61;
  uVar49 = extraout_RDX[1];
  lVar44 = (long)(int)uVar49;
  uVar62 = extraout_RDX[2];
  psVar45 = (secp256k1_modinv32_signed30 *)(long)(int)uVar62;
  lStack_80 = (long)(int)extraout_RDX[3];
  psVar63 = (secp256k1_fe *)0x9;
  pcStack_90 = (code *)0x15715a;
  a_01 = a_00;
  lStack_70 = unaff_RBX;
  iVar39 = secp256k1_modinv32_mul_cmp_30(a_00,9,psVar47,-2);
  if (iVar39 < 1) {
    pcStack_90 = (code *)0x1573c2;
    secp256k1_modinv32_update_de_30_cold_12();
LAB_001573c2:
    pcStack_90 = (code *)0x1573c7;
    secp256k1_modinv32_update_de_30_cold_11();
LAB_001573c7:
    pcStack_90 = (code *)0x1573cc;
    secp256k1_modinv32_update_de_30_cold_10();
LAB_001573cc:
    pcStack_90 = (code *)0x1573d1;
    secp256k1_modinv32_update_de_30_cold_9();
LAB_001573d1:
    pcStack_90 = (code *)0x1573d6;
    secp256k1_modinv32_update_de_30_cold_8();
LAB_001573d6:
    pcStack_90 = (code *)0x1573db;
    secp256k1_modinv32_update_de_30_cold_7();
LAB_001573db:
    pcStack_90 = (code *)0x1573e0;
    secp256k1_modinv32_update_de_30_cold_1();
LAB_001573e0:
    pcStack_90 = (code *)0x1573e5;
    secp256k1_modinv32_update_de_30_cold_2();
    psVar84 = psVar47;
LAB_001573e5:
    pcStack_90 = (code *)0x1573ea;
    secp256k1_modinv32_update_de_30_cold_6();
LAB_001573ea:
    pcStack_90 = (code *)0x1573ef;
    secp256k1_modinv32_update_de_30_cold_5();
LAB_001573ef:
    pcStack_90 = (code *)0x1573f4;
    secp256k1_modinv32_update_de_30_cold_4();
  }
  else {
    psVar63 = (secp256k1_fe *)0x9;
    pcStack_90 = (code *)0x157177;
    a_01 = a_00;
    iVar39 = secp256k1_modinv32_mul_cmp_30(a_00,9,psVar47,1);
    if (-1 < iVar39) goto LAB_001573c2;
    psVar63 = (secp256k1_fe *)0x9;
    pcStack_90 = (code *)0x157194;
    a_01 = f;
    iVar39 = secp256k1_modinv32_mul_cmp_30(f,9,psVar47,-2);
    if (iVar39 < 1) goto LAB_001573c7;
    psVar63 = (secp256k1_fe *)0x9;
    pcStack_90 = (code *)0x1571b1;
    a_01 = f;
    iVar39 = secp256k1_modinv32_mul_cmp_30(f,9,psVar47,1);
    if (-1 < iVar39) goto LAB_001573cc;
    psVar84 = (secp256k1_modinv32_signed30 *)-(long)psVar87;
    if (0 < (long)psVar87) {
      psVar84 = psVar87;
    }
    lVar81 = -lVar44;
    if (lVar44 < 1) {
      lVar81 = lVar44;
    }
    if (lVar81 + 0x40000000 < (long)psVar84) goto LAB_001573d1;
    psVar84 = (secp256k1_modinv32_signed30 *)-(long)psVar45;
    if (0 < (long)psVar45) {
      psVar84 = psVar45;
    }
    lVar81 = -lStack_80;
    if (lStack_80 < 1) {
      lVar81 = lStack_80;
    }
    if (lVar81 + 0x40000000 < (long)psVar84) goto LAB_001573d6;
    uVar68 = a_00->v[8] >> 0x1f;
    uVar60 = f->v[8] >> 0x1f;
    psVar63 = (secp256k1_fe *)(ulong)uVar60;
    iVar39 = (uVar60 & uVar49) + (uVar68 & uVar61);
    a_01 = (secp256k1_modinv32_signed30 *)(f->v[0] * lVar44 + (long)a_00->v[0] * (long)psVar87);
    lVar81 = (long)(int)(iVar39 - ((int)a_01 * psVar47[1].v[0] + iVar39 & 0x3fffffffU));
    piVar50 = (int32_t *)((long)a_01->v + lVar81 * psVar47->v[0]);
    if (((ulong)piVar50 & 0x3fffffff) != 0) goto LAB_001573db;
    iVar39 = (uVar60 & (uint)lStack_80) + (uVar68 & uVar62);
    lVar82 = f->v[0] * lStack_80 + (long)a_00->v[0] * (long)psVar45;
    a_01 = (secp256k1_modinv32_signed30 *)0x3fffffff;
    uVar61 = iVar39 - (psVar47[1].v[0] * (int)lVar82 + iVar39 & 0x3fffffffU);
    psVar63 = (secp256k1_fe *)(ulong)uVar61;
    uVar43 = (long)psVar47->v[0] * (long)(int)uVar61 + lVar82;
    lStack_78 = lVar81;
    if ((uVar43 & 0x3fffffff) != 0) goto LAB_001573e0;
    lVar82 = (long)uVar43 >> 0x1e;
    lVar51 = (long)piVar50 >> 0x1e;
    lVar66 = 1;
    do {
      lVar51 = psVar47->v[lVar66] * lVar81 + f->v[lVar66] * lVar44 +
               (long)a_00->v[lVar66] * (long)psVar87 + lVar51;
      psVar84 = (secp256k1_modinv32_signed30 *)(f->v[lVar66] * lStack_80);
      lVar82 = (long)psVar84->v +
               (long)a_00->v[lVar66] * (long)psVar45 + lVar82 +
               (long)psVar47->v[lVar66] * (long)(int)uVar61;
      a_00->v[lVar66 + -1] = (uint)lVar51 & 0x3fffffff;
      f->v[lVar66 + -1] = (uint)lVar82 & 0x3fffffff;
      lVar66 = lVar66 + 1;
      lVar82 = lVar82 >> 0x1e;
      lVar51 = lVar51 >> 0x1e;
    } while (lVar66 != 9);
    a_00->v[8] = (int32_t)lVar51;
    f->v[8] = (int32_t)lVar82;
    psVar63 = (secp256k1_fe *)0x9;
    pcStack_90 = (code *)0x15735b;
    a_01 = a_00;
    iVar39 = secp256k1_modinv32_mul_cmp_30(a_00,9,psVar47,-2);
    psVar45 = f;
    psVar87 = psVar47;
    if (iVar39 < 1) goto LAB_001573e5;
    psVar63 = (secp256k1_fe *)0x9;
    pcStack_90 = (code *)0x157378;
    a_01 = a_00;
    iVar39 = secp256k1_modinv32_mul_cmp_30(a_00,9,psVar47,1);
    if (-1 < iVar39) goto LAB_001573ea;
    psVar63 = (secp256k1_fe *)0x9;
    pcStack_90 = (code *)0x157391;
    a_01 = f;
    iVar39 = secp256k1_modinv32_mul_cmp_30(f,9,psVar47,-2);
    if (iVar39 < 1) goto LAB_001573ef;
    psVar63 = (secp256k1_fe *)0x9;
    pcStack_90 = (code *)0x1573aa;
    a_01 = f;
    iVar39 = secp256k1_modinv32_mul_cmp_30(f,9,psVar47,1);
    if (iVar39 < 0) {
      return;
    }
  }
  pcStack_90 = secp256k1_modinv32_normalize_30;
  secp256k1_modinv32_update_de_30_cold_3();
  uVar61 = a_01->v[0];
  uVar64 = (ulong)uVar61;
  uVar49 = a_01->v[3];
  uVar52 = (ulong)uVar49;
  uVar62 = a_01->v[4];
  uVar80 = (ulong)uVar62;
  uVar60 = a_01->v[5];
  uVar59 = (ulong)uVar60;
  psVar47 = (secp256k1_modinv32_signed30 *)(ulong)(uint)a_01->v[6];
  uVar68 = a_01->v[7];
  uVar43 = (ulong)uVar68;
  iStack_bc = a_01->v[8];
  lVar81 = 0;
  do {
    psStack_b8 = psVar45;
    psStack_b0 = psVar84;
    psStack_a8 = psVar87;
    psStack_a0 = f;
    psStack_98 = a_00;
    pcStack_90 = (code *)lVar44;
    if (a_01->v[lVar81] < -0x3fffffff) {
      pcStack_f8 = (code *)0x157742;
      secp256k1_modinv32_normalize_30_cold_7();
LAB_00157742:
      pcStack_f8 = (code *)0x157747;
      secp256k1_modinv32_normalize_30_cold_6();
      goto LAB_00157747;
    }
    if (0x3fffffff < a_01->v[lVar81]) goto LAB_00157742;
    lVar81 = lVar81 + 1;
  } while (lVar81 != 9);
  uStack_dc = (uint)psVar63;
  psVar63 = (secp256k1_fe *)0x9;
  pcStack_f8 = (code *)0x15747f;
  psVar47 = a_01;
  uStack_e8 = a_01->v[1];
  uStack_e4 = a_01->v[2];
  uStack_e0 = a_01->v[6];
  psStack_d8 = b;
  iVar39 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,-2);
  if (iVar39 < 1) {
LAB_00157747:
    pcStack_f8 = (code *)0x15774c;
    secp256k1_modinv32_normalize_30_cold_5();
LAB_0015774c:
    pcStack_f8 = (code *)0x157751;
    secp256k1_modinv32_normalize_30_cold_4();
LAB_00157751:
    pcStack_f8 = (code *)0x157756;
    secp256k1_modinv32_normalize_30_cold_3();
LAB_00157756:
    pcStack_f8 = (code *)0x15775b;
    secp256k1_modinv32_normalize_30_cold_2();
  }
  else {
    psVar63 = (secp256k1_fe *)0x9;
    pcStack_f8 = (code *)0x15749e;
    psVar47 = a_01;
    iVar39 = secp256k1_modinv32_mul_cmp_30(a_01,9,psStack_d8,1);
    if (-1 < iVar39) goto LAB_0015774c;
    uVar40 = iStack_bc >> 0x1f;
    uStack_c0 = psStack_d8->v[1];
    uVar41 = (uVar40 & uStack_c0) + uStack_e8;
    uStack_e8 = psStack_d8->v[2];
    uVar48 = (uVar40 & uStack_e8) + uStack_e4;
    uStack_e4 = psStack_d8->v[3];
    uStack_c4 = psStack_d8->v[4];
    uStack_c8 = psStack_d8->v[5];
    uStack_cc = psStack_d8->v[6];
    uVar86 = (uVar40 & uStack_cc) + uStack_e0;
    uStack_e0 = psStack_d8->v[7];
    uStack_ec = (int)uStack_dc >> 0x1f;
    uStack_dc = psStack_d8->v[8];
    uVar72 = ((uVar40 & psStack_d8->v[0]) + uVar61 ^ uStack_ec) - uStack_ec;
    uVar69 = ((int)uVar72 >> 0x1e) + ((uVar41 ^ uStack_ec) - uStack_ec);
    uVar41 = ((int)uVar69 >> 0x1e) + ((uVar48 ^ uStack_ec) - uStack_ec);
    uVar88 = ((int)uVar41 >> 0x1e) + (((uVar40 & uStack_e4) + uVar49 ^ uStack_ec) - uStack_ec);
    uVar49 = ((int)uVar88 >> 0x1e) + (((uVar40 & uStack_c4) + uVar62 ^ uStack_ec) - uStack_ec);
    uVar61 = ((int)uVar49 >> 0x1e) + (((uVar40 & uStack_c8) + uVar60 ^ uStack_ec) - uStack_ec);
    uVar62 = ((int)uVar61 >> 0x1e) + ((uVar86 ^ uStack_ec) - uStack_ec);
    uVar60 = ((int)uVar62 >> 0x1e) + (((uVar40 & uStack_e0) + uVar68 ^ uStack_ec) - uStack_ec);
    uVar83 = ((int)uVar60 >> 0x1e) + (((uVar40 & uStack_dc) + iStack_bc ^ uStack_ec) - uStack_ec);
    uVar59 = (ulong)uVar83;
    uStack_f0 = (int)uVar83 >> 0x1f;
    uVar86 = (psStack_d8->v[0] & uStack_f0) + (uVar72 & 0x3fffffff);
    uVar48 = (uStack_c8 & uStack_f0) + (uVar61 & 0x3fffffff);
    uVar64 = (ulong)uVar48;
    uVar72 = (uStack_cc & uStack_f0) + (uVar62 & 0x3fffffff);
    uVar52 = (ulong)uVar72;
    uVar61 = ((int)uVar86 >> 0x1e) + (uStack_c0 & uStack_f0) + (uVar69 & 0x3fffffff);
    uVar62 = ((int)uVar61 >> 0x1e) + (uStack_e8 & uStack_f0) + (uVar41 & 0x3fffffff);
    uVar68 = ((int)uVar62 >> 0x1e) + (uStack_e4 & uStack_f0) + (uVar88 & 0x3fffffff);
    uVar40 = ((int)uVar68 >> 0x1e) + (uStack_c4 & uStack_f0) + (uVar49 & 0x3fffffff);
    uVar48 = ((int)uVar40 >> 0x1e) + uVar48;
    uVar72 = ((int)uVar48 >> 0x1e) + uVar72;
    uVar49 = ((int)uVar72 >> 0x1e) + (uStack_e0 & uStack_f0) + (uVar60 & 0x3fffffff);
    uVar60 = ((int)uVar49 >> 0x1e) + (uStack_dc & uStack_f0) + uVar83;
    uVar80 = (ulong)uVar60;
    uVar68 = uVar68 & 0x3fffffff;
    psVar63 = (secp256k1_fe *)(ulong)uVar68;
    uVar40 = uVar40 & 0x3fffffff;
    psVar47 = (secp256k1_modinv32_signed30 *)(ulong)uVar40;
    uVar49 = uVar49 & 0x3fffffff;
    uVar43 = (ulong)uVar49;
    a_01->v[0] = uVar86 & 0x3fffffff;
    a_01->v[1] = uVar61 & 0x3fffffff;
    a_01->v[2] = uVar62 & 0x3fffffff;
    a_01->v[3] = uVar68;
    a_01->v[4] = uVar40;
    a_01->v[5] = uVar48 & 0x3fffffff;
    a_01->v[6] = uVar72 & 0x3fffffff;
    a_01->v[7] = uVar49;
    a_01->v[8] = uVar60;
    if (0x3fffffff < uVar60) goto LAB_00157751;
    psVar63 = (secp256k1_fe *)0x9;
    pcStack_f8 = (code *)0x15770f;
    psVar47 = a_01;
    iVar39 = secp256k1_modinv32_mul_cmp_30(a_01,9,psStack_d8,0);
    if (iVar39 < 0) goto LAB_00157756;
    psVar63 = (secp256k1_fe *)0x9;
    pcStack_f8 = (code *)0x15772a;
    psVar47 = a_01;
    iVar39 = secp256k1_modinv32_mul_cmp_30(a_01,9,psStack_d8,1);
    if (iVar39 < 0) {
      return;
    }
  }
  pcStack_f8 = test_inverse_field;
  secp256k1_modinv32_normalize_30_cold_1();
  a = &sStack_1b8;
  psVar58 = &sStack_1b8;
  pcVar85 = secp256k1_fe_inv_var;
  if (extraout_EDX_00 == 0) {
    pcVar85 = secp256k1_fe_inv;
  }
  pcStack_1c0 = (code *)0x157791;
  uStack_120 = uVar43;
  uStack_118 = uVar59;
  uStack_110 = uVar52;
  psStack_108 = a_01;
  uStack_100 = uVar64;
  pcStack_f8 = (code *)uVar80;
  (*pcVar85)(&sStack_1b8);
  if (psVar47 != (secp256k1_modinv32_signed30 *)0x0) {
    *(uint64_t *)(psVar47->v + 8) = sStack_1b8.n[4];
    *(ulong *)(psVar47[1].v + 1) = CONCAT44(sStack_1b8.normalized,sStack_1b8.magnitude);
    *(uint64_t *)(psVar47->v + 4) = sStack_1b8.n[2];
    *(uint64_t *)(psVar47->v + 6) = sStack_1b8.n[3];
    *(uint64_t *)psVar47->v = sStack_1b8.n[0];
    *(uint64_t *)(psVar47->v + 2) = sStack_1b8.n[1];
  }
  uVar59 = 0xffffffffffff;
  sStack_158.n[0] = psVar63->n[0];
  sStack_158.n[1] = psVar63->n[1];
  sStack_158.n[2] = psVar63->n[2];
  sStack_158.n[3] = psVar63->n[3];
  sStack_158.n[4] = psVar63->n[4];
  sStack_158.magnitude = psVar63->magnitude;
  sStack_158.normalized = psVar63->normalized;
  psVar65 = &sStack_158;
  pcStack_1c0 = (code *)0x1577fa;
  secp256k1_fe_verify(psVar65);
  uVar43 = 0x1000003d1;
  uVar80 = (sStack_158.n[4] >> 0x30) * 0x1000003d1 + sStack_158.n[0];
  if (((uVar80 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar80 & 0xfffffffffffff) == 0)) {
    uVar52 = (uVar80 >> 0x34) + sStack_158.n[1];
    uVar64 = (uVar52 >> 0x34) + sStack_158.n[2];
    uVar67 = (uVar64 >> 0x34) + sStack_158.n[3];
    uVar70 = (uVar67 >> 0x34) + (sStack_158.n[4] & 0xffffffffffff);
    if ((((uVar52 | uVar80 | uVar64 | uVar67) & 0xfffffffffffff) != 0 || uVar70 != 0) &&
       (((uVar80 | 0x1000003d0) & uVar52 & uVar64 & uVar67 & (uVar70 ^ 0xf000000000000)) !=
        0xfffffffffffff)) goto LAB_001578a1;
LAB_00157c6b:
    pcStack_1c0 = (code *)0x157c76;
    secp256k1_fe_verify(&sStack_1b8);
    uVar59 = sStack_1b8.n[4] & 0xffffffffffff;
    uVar80 = (sStack_1b8.n[4] >> 0x30) * 0x1000003d1 + sStack_1b8.n[0];
    uVar52 = (uVar80 >> 0x34) + sStack_1b8.n[1];
    uVar64 = (uVar52 >> 0x34) + sStack_1b8.n[2];
    a = (secp256k1_fe *)((uVar64 >> 0x34) + sStack_1b8.n[3]);
    uVar67 = ((ulong)a >> 0x34) + uVar59;
    if ((((uVar52 | uVar80 | uVar64 | (ulong)a) & 0xfffffffffffff) == 0 && uVar67 == 0) ||
       (r = (secp256k1_fe *)(uVar67 ^ 0xf000000000000), psVar58 = &sStack_1b8,
       ((uVar80 ^ 0x1000003d0) & uVar52 & uVar64 & (ulong)a & (ulong)r) == 0xfffffffffffff)) {
      return;
    }
  }
  else {
LAB_001578a1:
    pcStack_1c0 = (code *)0x1578b4;
    psVar65 = psVar63;
    secp256k1_fe_mul(&sStack_158,psVar63,&sStack_1b8);
    pcStack_1c0 = (code *)0x1578bc;
    secp256k1_fe_verify(&sStack_158);
    r = &fe_minus_one;
    pcStack_1c0 = (code *)0x1578c8;
    secp256k1_fe_verify(&fe_minus_one);
    if (sStack_158.magnitude < 0x20) {
      sStack_158.n[0] = sStack_158.n[0] + 0xffffefffffc2e;
      sStack_158.n[1] = sStack_158.n[1] + 0xfffffffffffff;
      sStack_158.n[2] = sStack_158.n[2] + 0xfffffffffffff;
      sStack_158.n[3] = sStack_158.n[3] + 0xfffffffffffff;
      sStack_158.n[4] = sStack_158.n[4] + 0xffffffffffff;
      sStack_158.normalized = 0;
      sStack_158.magnitude = sStack_158.magnitude + 1;
      pcStack_1c0 = (code *)0x15791a;
      secp256k1_fe_verify(&sStack_158);
      pcStack_1c0 = (code *)0x157922;
      secp256k1_fe_verify(&sStack_158);
      uVar80 = (sStack_158.n[4] >> 0x30) * 0x1000003d1 + sStack_158.n[0];
      uVar52 = (uVar80 >> 0x34) + sStack_158.n[1];
      uVar64 = (uVar52 >> 0x34) + sStack_158.n[2];
      psVar65 = (secp256k1_fe *)((uVar64 >> 0x34) + sStack_158.n[3]);
      uVar67 = ((ulong)psVar65 >> 0x34) + (sStack_158.n[4] & 0xffffffffffff);
      if ((((uVar52 | uVar80 | uVar64 | (ulong)psVar65) & 0xfffffffffffff) != 0 || uVar67 != 0) &&
         (r = (secp256k1_fe *)(uVar67 ^ 0xf000000000000),
         ((uVar80 ^ 0x1000003d0) & uVar52 & uVar64 & (ulong)psVar65 & (ulong)r) != 0xfffffffffffff))
      goto LAB_00157d09;
      sStack_188.n[0] = psVar63->n[0];
      sStack_188.n[1] = psVar63->n[1];
      sStack_188.n[2] = psVar63->n[2];
      sStack_188.n[3] = psVar63->n[3];
      sStack_188.n[4] = psVar63->n[4];
      sStack_188.magnitude = psVar63->magnitude;
      sStack_188.normalized = psVar63->normalized;
      psVar63 = &sStack_188;
      pcStack_1c0 = (code *)0x1579c8;
      secp256k1_fe_verify(psVar63);
      r = &fe_minus_one;
      pcStack_1c0 = (code *)0x1579d4;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_188.magnitude) goto LAB_00157d0e;
      sStack_188.n[0] = sStack_188.n[0] + 0xffffefffffc2e;
      sStack_188.n[1] = sStack_188.n[1] + 0xfffffffffffff;
      sStack_188.n[2] = sStack_188.n[2] + 0xfffffffffffff;
      sStack_188.n[3] = sStack_188.n[3] + 0xfffffffffffff;
      sStack_188.n[4] = sStack_188.n[4] + 0xffffffffffff;
      sStack_188.normalized = 0;
      sStack_188.magnitude = sStack_188.magnitude + 1;
      pcStack_1c0 = (code *)0x157a1f;
      secp256k1_fe_verify(&sStack_188);
      pcStack_1c0 = (code *)0x157a27;
      secp256k1_fe_verify(&sStack_188);
      uVar80 = (sStack_188.n[4] >> 0x30) * 0x1000003d1 + sStack_188.n[0];
      if (((uVar80 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar80 & 0xfffffffffffff) == 0)) {
        uVar52 = (uVar80 >> 0x34) + sStack_188.n[1];
        uVar64 = (uVar52 >> 0x34) + sStack_188.n[2];
        uVar67 = (uVar64 >> 0x34) + sStack_188.n[3];
        uVar70 = (uVar67 >> 0x34) + (sStack_188.n[4] & 0xffffffffffff);
        if (((uVar52 | uVar80 | uVar64 | uVar67) & 0xfffffffffffff) == 0 && uVar70 == 0) {
          return;
        }
        if (((uVar80 | 0x1000003d0) & uVar52 & uVar64 & uVar67 & (uVar70 ^ 0xf000000000000)) ==
            0xfffffffffffff) {
          return;
        }
      }
      psVar65 = &sStack_188;
      pcStack_1c0 = (code *)0x157ad6;
      (*pcVar85)();
      pcStack_1c0 = (code *)0x157ae1;
      secp256k1_fe_verify(&sStack_1b8);
      r = &fe_minus_one;
      pcStack_1c0 = (code *)0x157aed;
      secp256k1_fe_verify(&fe_minus_one);
      psVar63 = &sStack_1b8;
      if (0x1f < sStack_1b8.magnitude) goto LAB_00157d13;
      sStack_1b8.n[0] = sStack_1b8.n[0] + 0xffffefffffc2e;
      sStack_1b8.n[1] = sStack_1b8.n[1] + 0xfffffffffffff;
      sStack_1b8.n[2] = sStack_1b8.n[2] + 0xfffffffffffff;
      sStack_1b8.n[3] = sStack_1b8.n[3] + 0xfffffffffffff;
      sStack_1b8.n[4] = sStack_1b8.n[4] + 0xffffffffffff;
      sStack_1b8.magnitude = sStack_1b8.magnitude + 1;
      sStack_1b8.normalized = 0;
      pcStack_1c0 = (code *)0x157b36;
      secp256k1_fe_verify(&sStack_1b8);
      pcStack_1c0 = (code *)0x157b3f;
      (*pcVar85)(&sStack_1b8);
      pcStack_1c0 = (code *)0x157b47;
      secp256k1_fe_verify(&sStack_1b8);
      sStack_1b8.n[0] = sStack_1b8.n[0] + 1;
      sStack_1b8.magnitude = sStack_1b8.magnitude + 1;
      sStack_1b8.normalized = 0;
      pcStack_1c0 = (code *)0x157b59;
      secp256k1_fe_verify(&sStack_1b8);
      pcStack_1c0 = (code *)0x157b61;
      secp256k1_fe_verify(&sStack_1b8);
      psVar65 = &sStack_188;
      pcStack_1c0 = (code *)0x157b6e;
      r = psVar65;
      secp256k1_fe_verify(psVar65);
      if (sStack_188.magnitude + sStack_1b8.magnitude < 0x21) {
        sStack_1b8.n[0] = sStack_1b8.n[0] + sStack_188.n[0];
        sStack_1b8.n[1] = sStack_1b8.n[1] + sStack_188.n[1];
        sStack_1b8.n[2] = sStack_1b8.n[2] + sStack_188.n[2];
        sStack_1b8.n[3] = sStack_1b8.n[3] + sStack_188.n[3];
        sStack_1b8.n[4] = sStack_1b8.n[4] + sStack_188.n[4];
        sStack_1b8.normalized = 0;
        pcStack_1c0 = (code *)0x157bba;
        sStack_1b8.magnitude = sStack_188.magnitude + sStack_1b8.magnitude;
        secp256k1_fe_verify(&sStack_1b8);
        pcStack_1c0 = (code *)0x157bc2;
        secp256k1_fe_verify(&sStack_1b8);
        uVar80 = (sStack_1b8.n[4] >> 0x30) * 0x1000003d1 + sStack_1b8.n[0];
        if (((uVar80 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar80 & 0xfffffffffffff) == 0)) {
          uVar59 = (uVar80 >> 0x34) + sStack_1b8.n[1];
          uVar52 = (uVar59 >> 0x34) + sStack_1b8.n[2];
          uVar64 = (uVar52 >> 0x34) + sStack_1b8.n[3];
          uVar67 = (uVar64 >> 0x34) + (sStack_1b8.n[4] & 0xffffffffffff);
          if (((uVar59 | uVar80 | uVar52 | uVar64) & 0xfffffffffffff) == 0 && uVar67 == 0) {
            return;
          }
          if (((uVar80 | 0x1000003d0) & uVar59 & uVar52 & uVar64 & (uVar67 ^ 0xf000000000000)) ==
              0xfffffffffffff) {
            return;
          }
        }
        pcStack_1c0 = (code *)0x157c6b;
        test_inverse_field_cold_2();
        goto LAB_00157c6b;
      }
    }
    else {
      pcStack_1c0 = (code *)0x157d09;
      test_inverse_field_cold_7();
LAB_00157d09:
      pcStack_1c0 = (code *)0x157d0e;
      test_inverse_field_cold_6();
LAB_00157d0e:
      pcStack_1c0 = (code *)0x157d13;
      test_inverse_field_cold_5();
LAB_00157d13:
      a = psVar65;
      psVar58 = psVar63;
      psVar65 = &sStack_158;
      pcStack_1c0 = (code *)0x157d18;
      test_inverse_field_cold_4();
    }
    pcStack_1c0 = (code *)0x157d1d;
    test_inverse_field_cold_3();
  }
  pcStack_1c0 = test_inverse_scalar;
  test_inverse_field_cold_1();
  uStack_1c8 = 0xfffffffffffff;
  uStack_1d8 = 0x1000003d1;
  pcVar89 = secp256k1_scalar_inverse_var;
  if (extraout_EDX_01 == 0) {
    pcVar89 = secp256k1_scalar_inverse;
  }
  psVar63 = (secp256k1_fe *)auStack_270;
  psStack_288 = (secp256k1_fe *)0x157d58;
  r_00 = psVar63;
  auStack_208._32_8_ = psVar58;
  auStack_208._40_8_ = pcVar85;
  psStack_1d0 = psVar65;
  pcStack_1c0 = (code *)uVar59;
  uVar42 = (*pcVar89)();
  if (r != (secp256k1_fe *)0x0) {
    r->n[2] = CONCAT44(auStack_270._20_4_,auStack_270._16_4_);
    r->n[3] = CONCAT44(auStack_270._28_4_,auStack_270._24_4_);
    r->n[0] = CONCAT44(auStack_270._4_4_,auStack_270._0_4_);
    r->n[1] = CONCAT44(auStack_270._12_4_,auStack_270._8_4_);
  }
  uVar49 = 0;
  uVar62 = 0;
  uVar60 = 0;
  uVar68 = 0;
  auVar92._0_4_ = -(uint)((int)a->n[2] == 0 && (int)a->n[0] == 0);
  auVar92._4_4_ = -(uint)(*(int *)((long)a->n + 0x14) == 0 && *(int *)((long)a->n + 4) == 0);
  auVar92._8_4_ = -(uint)((int)a->n[3] == 0 && (int)a->n[1] == 0);
  auVar92._12_4_ = -(uint)(*(int *)((long)a->n + 0x1c) == 0 && *(int *)((long)a->n + 0xc) == 0);
  uVar61 = movmskps(uVar42,auVar92);
  uVar61 = uVar61 ^ 0xf;
  if (uVar61 != 0) {
    uVar80 = a->n[0];
    uVar59 = a->n[1];
    uVar52 = a->n[2];
    uVar57 = CONCAT44(auStack_270._4_4_,auStack_270._0_4_);
    pcVar85 = (code *)CONCAT44(auStack_270._12_4_,auStack_270._8_4_);
    uVar43 = CONCAT44(auStack_270._20_4_,auStack_270._16_4_);
    r = (secp256k1_fe *)CONCAT44(auStack_270._28_4_,auStack_270._24_4_);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar80;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar57;
    uVar53 = SUB168(auVar4 * auVar20,8);
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar53;
    sStack_250.n[0] = SUB168(auVar4 * auVar20,0);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar80;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = pcVar85;
    auVar5 = auVar5 * auVar21;
    uVar71 = SUB168(auVar5 + auVar38,0);
    uVar73 = SUB168(auVar5 + auVar38,8);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar59;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar57;
    uVar54 = SUB168(auVar6 * auVar22,8);
    uVar70 = SUB168(auVar6 * auVar22,0);
    uVar64 = (ulong)CARRY8(uVar71,uVar70);
    uVar67 = uVar73 + uVar54;
    uVar74 = uVar67 + uVar64;
    uVar76 = (ulong)CARRY8(auVar5._8_8_,(ulong)CARRY8(uVar53,auVar5._0_8_)) +
             (ulong)(CARRY8(uVar73,uVar54) || CARRY8(uVar67,uVar64));
    sStack_250.n[1] = uVar71 + uVar70;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar80;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar43;
    uVar55 = SUB168(auVar7 * auVar23,8);
    uVar64 = SUB168(auVar7 * auVar23,0);
    uVar70 = uVar74 + uVar64;
    uVar64 = (ulong)CARRY8(uVar74,uVar64);
    uVar53 = uVar76 + uVar55;
    uVar77 = uVar53 + uVar64;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar59;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = pcVar85;
    uVar74 = SUB168(auVar8 * auVar24,8);
    uVar67 = SUB168(auVar8 * auVar24,0);
    uVar75 = uVar70 + uVar67;
    uVar67 = (ulong)CARRY8(uVar70,uVar67);
    uVar54 = uVar77 + uVar74;
    uVar78 = uVar54 + uVar67;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar52;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar57;
    uVar56 = SUB168(auVar9 * auVar25,8);
    uVar73 = SUB168(auVar9 * auVar25,0);
    uVar70 = (ulong)CARRY8(uVar75,uVar73);
    uVar71 = uVar78 + uVar56;
    uVar79 = uVar71 + uVar70;
    uVar76 = (ulong)(CARRY8(uVar76,uVar55) || CARRY8(uVar53,uVar64)) +
             (ulong)(CARRY8(uVar77,uVar74) || CARRY8(uVar54,uVar67)) +
             (ulong)(CARRY8(uVar78,uVar56) || CARRY8(uVar71,uVar70));
    sStack_250.n[2] = uVar75 + uVar73;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar80;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = r;
    uVar73 = SUB168(auVar10 * auVar26,8);
    uVar80 = SUB168(auVar10 * auVar26,0);
    uVar67 = uVar79 + uVar80;
    uVar80 = (ulong)CARRY8(uVar79,uVar80);
    uVar53 = uVar76 + uVar73;
    uVar75 = uVar53 + uVar80;
    pcVar90 = (code *)a->n[3];
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar59;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar43;
    uVar55 = SUB168(auVar11 * auVar27,8);
    uVar64 = SUB168(auVar11 * auVar27,0);
    uVar70 = uVar67 + uVar64;
    uVar64 = (ulong)CARRY8(uVar67,uVar64);
    uVar54 = uVar75 + uVar55;
    uVar77 = uVar54 + uVar64;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar52;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = pcVar85;
    uVar74 = SUB168(auVar12 * auVar28,8);
    uVar67 = SUB168(auVar12 * auVar28,0);
    uVar79 = uVar70 + uVar67;
    uVar67 = (ulong)CARRY8(uVar70,uVar67);
    uVar71 = uVar77 + uVar74;
    uVar78 = uVar71 + uVar67;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = pcVar90;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar57;
    uVar56 = SUB168(auVar13 * auVar29,8);
    uVar70 = SUB168(auVar13 * auVar29,0);
    sStack_250.n[3] = uVar79 + uVar70;
    uVar70 = (ulong)CARRY8(uVar79,uVar70);
    uVar57 = uVar78 + uVar56;
    uVar79 = uVar57 + uVar70;
    uVar73 = (ulong)(CARRY8(uVar76,uVar73) || CARRY8(uVar53,uVar80)) +
             (ulong)(CARRY8(uVar75,uVar55) || CARRY8(uVar54,uVar64)) +
             (ulong)(CARRY8(uVar77,uVar74) || CARRY8(uVar71,uVar67)) +
             (ulong)(CARRY8(uVar78,uVar56) || CARRY8(uVar57,uVar70));
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar59;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = r;
    uVar54 = SUB168(auVar14 * auVar30,8);
    uVar80 = SUB168(auVar14 * auVar30,0);
    uVar64 = uVar79 + uVar80;
    uVar80 = (ulong)CARRY8(uVar79,uVar80);
    uVar67 = uVar73 + uVar54;
    uVar55 = uVar67 + uVar80;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar52;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar43;
    uVar71 = SUB168(auVar15 * auVar31,8);
    uVar59 = SUB168(auVar15 * auVar31,0);
    uVar53 = uVar64 + uVar59;
    uVar59 = (ulong)CARRY8(uVar64,uVar59);
    uVar70 = uVar55 + uVar71;
    uVar74 = uVar70 + uVar59;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = pcVar90;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = pcVar85;
    uVar57 = SUB168(auVar16 * auVar32,8);
    uVar64 = SUB168(auVar16 * auVar32,0);
    sStack_250.n[4] = uVar53 + uVar64;
    uVar64 = (ulong)CARRY8(uVar53,uVar64);
    uVar53 = uVar74 + uVar57;
    uVar56 = uVar53 + uVar64;
    uVar53 = (ulong)(CARRY8(uVar73,uVar54) || CARRY8(uVar67,uVar80)) +
             (ulong)(CARRY8(uVar55,uVar71) || CARRY8(uVar70,uVar59)) +
             (ulong)(CARRY8(uVar74,uVar57) || CARRY8(uVar53,uVar64));
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar52;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = r;
    uVar67 = SUB168(auVar17 * auVar33,8);
    uVar80 = SUB168(auVar17 * auVar33,0);
    uVar64 = uVar56 + uVar80;
    uVar80 = (ulong)CARRY8(uVar56,uVar80);
    uVar52 = uVar53 + uVar67;
    uVar54 = uVar52 + uVar80;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = pcVar90;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar43;
    uVar70 = SUB168(auVar18 * auVar34,8);
    uVar59 = SUB168(auVar18 * auVar34,0);
    sStack_250._40_8_ = uVar64 + uVar59;
    uVar59 = (ulong)CARRY8(uVar64,uVar59);
    uVar64 = uVar54 + uVar70;
    auStack_220._8_8_ =
         (ulong)(CARRY8(uVar53,uVar67) || CARRY8(uVar52,uVar80)) +
         (ulong)(CARRY8(uVar54,uVar70) || CARRY8(uVar64,uVar59));
    auStack_220._0_8_ = uVar64 + uVar59;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = pcVar90;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = r;
    auStack_220 = auVar19 * auVar35 + auStack_220;
    psVar63 = (secp256k1_fe *)auStack_208;
    psStack_288 = (secp256k1_fe *)0x157ef3;
    r_00 = psVar63;
    pcStack_278 = pcVar89;
    secp256k1_scalar_reduce_512((secp256k1_scalar *)psVar63,(uint64_t *)(auStack_270 + 0x20));
    if (((auStack_208._0_8_ != 1 || auStack_208._8_8_ != 0) || auStack_208._16_8_ != 0) ||
        auStack_208._24_8_ != 0) {
      psStack_288 = (secp256k1_fe *)0x157fea;
      test_inverse_scalar_cold_1();
      goto LAB_00157fea;
    }
    psStack_288 = (secp256k1_fe *)0x157f23;
    iVar39 = secp256k1_scalar_add
                       ((secp256k1_scalar *)(auStack_270 + 0x20),(secp256k1_scalar *)a,
                        &scalar_minus_one);
    pcVar89 = pcStack_278;
    auVar91._0_4_ = -(uint)((int)sStack_250.n[2] == 0 && (int)sStack_250.n[0] == 0);
    auVar91._4_4_ = -(uint)(sStack_250.n[2]._4_4_ == 0 && sStack_250.n[0]._4_4_ == 0);
    auVar91._8_4_ = -(uint)((int)sStack_250.n[3] == 0 && (int)sStack_250.n[1] == 0);
    auVar91._12_4_ = -(uint)(sStack_250.n[3]._4_4_ == 0 && sStack_250.n[1]._4_4_ == 0);
    iVar39 = movmskps(iVar39,auVar91);
    if (iVar39 == 0xf) {
      return;
    }
    psVar63 = (secp256k1_fe *)(auStack_270 + 0x20);
    psStack_288 = (secp256k1_fe *)0x157f53;
    (*pcStack_278)(psVar63,psVar63);
    r = (secp256k1_fe *)auStack_270;
    psStack_288 = (secp256k1_fe *)0x157f6a;
    secp256k1_scalar_add((secp256k1_scalar *)r,&scalar_minus_one,(secp256k1_scalar *)r);
    psStack_288 = (secp256k1_fe *)0x157f73;
    (*pcVar89)(r,r);
    psStack_288 = (secp256k1_fe *)0x157f85;
    secp256k1_scalar_add((secp256k1_scalar *)r,(secp256k1_scalar *)r,&secp256k1_scalar_one);
    psStack_288 = (secp256k1_fe *)0x157f93;
    r_00 = r;
    iVar39 = secp256k1_scalar_add
                       ((secp256k1_scalar *)r,(secp256k1_scalar *)psVar63,(secp256k1_scalar *)r);
    auVar93._0_4_ = -(uint)(auStack_270._16_4_ == 0 && auStack_270._0_4_ == 0);
    auVar93._4_4_ = -(uint)(auStack_270._20_4_ == 0 && auStack_270._4_4_ == 0);
    auVar93._8_4_ = -(uint)(auStack_270._24_4_ == 0 && auStack_270._8_4_ == 0);
    auVar93._12_4_ = -(uint)(auStack_270._28_4_ == 0 && auStack_270._12_4_ == 0);
    iVar39 = movmskps(iVar39,auVar93);
    if (iVar39 == 0xf) {
      return;
    }
    psStack_288 = (secp256k1_fe *)0x157fb7;
    test_inverse_scalar_cold_2();
    uVar61 = extraout_EAX;
    uVar49 = extraout_XMM0_Da;
    uVar62 = extraout_XMM0_Db;
    uVar60 = extraout_XMM0_Dc;
    uVar68 = extraout_XMM0_Dd;
  }
  auVar94._0_4_ = -(uint)((auStack_270._16_4_ | auStack_270._0_4_) == uVar49);
  auVar94._4_4_ = -(uint)((auStack_270._20_4_ | auStack_270._4_4_) == uVar62);
  auVar94._8_4_ = -(uint)((auStack_270._24_4_ | auStack_270._8_4_) == uVar60);
  auVar94._12_4_ = -(uint)((auStack_270._28_4_ | auStack_270._12_4_) == uVar68);
  iVar39 = movmskps(uVar61,auVar94);
  pcVar90 = pcVar89;
  if (iVar39 == 0xf) {
    return;
  }
LAB_00157fea:
  psStack_288 = (secp256k1_fe *)random_fe;
  test_inverse_scalar_cold_3();
  psStack_2b0 = psVar63;
  pcStack_2a8 = pcVar85;
  uStack_2a0 = uVar43;
  psStack_298 = r;
  pcStack_290 = pcVar90;
  psStack_288 = a;
  do {
    secp256k1_testrand256(auStack_2d8);
    secp256k1_fe_impl_set_b32_mod(r_00,auStack_2d8);
    bVar36 = (r_00->n[2] & r_00->n[3] & r_00->n[1]) == 0xfffffffffffff;
    bVar37 = r_00->n[4] == 0xffffffffffff;
    bVar3 = 0xffffefffffc2e < r_00->n[0];
    if (bVar3 && (bVar36 && bVar37)) {
      r_00->magnitude = -1;
    }
    else {
      r_00->magnitude = 1;
      r_00->normalized = 1;
      secp256k1_fe_verify(r_00);
    }
  } while (bVar3 && (bVar36 && bVar37));
  return;
}

Assistant:

static void secp256k1_modinv32_update_fg_30_var(int len, secp256k1_modinv32_signed30 *f, secp256k1_modinv32_signed30 *g, const secp256k1_modinv32_trans2x2 *t) {
    const int32_t M30 = (int32_t)(UINT32_MAX >> 2);
    const int32_t u = t->u, v = t->v, q = t->q, r = t->r;
    int32_t fi, gi;
    int64_t cf, cg;
    int i;
    VERIFY_CHECK(len > 0);
    /* Start computing t*[f,g]. */
    fi = f->v[0];
    gi = g->v[0];
    cf = (int64_t)u * fi + (int64_t)v * gi;
    cg = (int64_t)q * fi + (int64_t)r * gi;
    /* Verify that the bottom 62 bits of the result are zero, and then throw them away. */
    VERIFY_CHECK(((int32_t)cf & M30) == 0); cf >>= 30;
    VERIFY_CHECK(((int32_t)cg & M30) == 0); cg >>= 30;
    /* Now iteratively compute limb i=1..len of t*[f,g], and store them in output limb i-1 (shifting
     * down by 30 bits). */
    for (i = 1; i < len; ++i) {
        fi = f->v[i];
        gi = g->v[i];
        cf += (int64_t)u * fi + (int64_t)v * gi;
        cg += (int64_t)q * fi + (int64_t)r * gi;
        f->v[i - 1] = (int32_t)cf & M30; cf >>= 30;
        g->v[i - 1] = (int32_t)cg & M30; cg >>= 30;
    }
    /* What remains is limb (len) of t*[f,g]; store it as output limb (len-1). */
    f->v[len - 1] = (int32_t)cf;
    g->v[len - 1] = (int32_t)cg;
}